

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O3

int fits_rcomp(int *a,int nx,uchar *c,int clen,int nblock)

{
  bool bVar1;
  void *__ptr;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uchar *__s;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  Buffer_t *pBVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  Buffer local_b0;
  int local_8c;
  uint local_88;
  uint local_84;
  long local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  size_t local_58;
  long local_50;
  int *local_48;
  void *local_40;
  ulong local_38;
  
  uVar10 = (ulong)(uint)nblock;
  local_b0.end = c + clen;
  local_58 = (long)nblock * 4;
  local_b0.start = c;
  local_b0.current = c;
  __ptr = malloc(local_58);
  if (__ptr == (void *)0x0) {
    ffpmsg("fits_rcomp: insufficient memory");
LAB_001fe972:
    local_b0.start._0_4_ = -1;
  }
  else {
    local_b0.bitbuffer = 0;
    local_b0.bits_to_go = 8;
    output_nbits(&local_b0,*a,0x20);
    if (0 < nx) {
      local_8c = *a;
      lVar8 = 0;
      local_68 = (ulong)(uint)nx;
      local_60 = (long)nblock;
      local_40 = __ptr;
      do {
        uVar13 = local_68 - lVar8;
        if (local_60 <= (long)(local_68 - lVar8)) {
          uVar13 = uVar10;
        }
        uVar10 = uVar13 & 0xffffffff;
        iVar11 = (int)uVar13;
        if (iVar11 < 1) {
          dVar14 = 0.0;
        }
        else {
          dVar14 = 0.0;
          uVar3 = 0;
          iVar5 = local_8c;
          do {
            local_8c = a[uVar3];
            uVar6 = local_8c - iVar5 >> 0x1f ^ (local_8c - iVar5) * 2;
            *(uint *)((long)__ptr + uVar3 * 4) = uVar6;
            dVar14 = dVar14 + (double)uVar6;
            uVar3 = uVar3 + 1;
            iVar5 = local_8c;
          } while ((uVar13 & 0xffffffff) != uVar3);
        }
        dVar16 = ((dVar14 - (double)((int)(((uint)(uVar13 >> 0x1f) & 1) + iVar11) >> 1)) + -1.0) /
                 (double)iVar11;
        dVar15 = 0.0;
        if (0.0 <= dVar16) {
          dVar15 = dVar16;
        }
        uVar6 = (uint)(long)dVar15;
        local_50 = lVar8;
        local_48 = a;
        if (uVar6 < 2) {
          if ((dVar14 != 0.0) || (NAN(dVar14))) {
            uVar3 = 0;
LAB_001fe787:
            local_80 = (long)dVar15;
            local_78 = uVar3;
            output_nbits(&local_b0,(int)uVar3 + 1,5);
            pBVar12 = local_b0.current;
            uVar6 = local_b0.bitbuffer;
            iVar5 = local_b0.bits_to_go;
            local_70 = uVar10;
            if (0 < iVar11) {
              uVar9 = ~(-1 << ((byte)local_78 & 0x1f));
              uVar13 = uVar13 & 0xffffffff;
              uVar3 = 0;
              lVar8 = local_80;
              uVar10 = local_78;
              local_88 = uVar9;
              local_38 = uVar13;
              do {
                uVar7 = *(uint *)((long)__ptr + uVar3 * 4);
                iVar11 = (int)uVar7 >> ((byte)uVar10 & 0x1f);
                uVar4 = iVar11 - iVar5;
                if (iVar11 < iVar5) {
                  uVar6 = uVar6 << ((byte)(iVar11 + 1) & 0x1f) | 1;
                  iVar11 = iVar5 - (iVar11 + 1);
                }
                else {
                  __s = pBVar12 + 1;
                  *pBVar12 = (uchar)(uVar6 << ((byte)iVar5 & 0x1f));
                  if (7 < (int)uVar4) {
                    if (0xe < uVar4) {
                      uVar4 = 0xf;
                    }
                    uVar6 = (iVar11 - (uVar4 + iVar5)) + 7;
                    uVar10 = (ulong)(uVar6 >> 3);
                    local_84 = uVar7;
                    memset(__s,0,uVar10 + 1);
                    __s = pBVar12 + uVar10 + 2;
                    uVar4 = (iVar11 + -8) - ((uVar6 & 0xfffffff8) + iVar5);
                    lVar8 = local_80;
                    uVar10 = local_78;
                    uVar13 = local_38;
                    __ptr = local_40;
                    uVar9 = local_88;
                    uVar7 = local_84;
                  }
                  iVar11 = 7 - uVar4;
                  uVar6 = 1;
                  pBVar12 = __s;
                }
                iVar5 = iVar11;
                if (1 < (uint)lVar8) {
                  iVar2 = (int)uVar10;
                  uVar6 = uVar7 & uVar9 | uVar6 << ((byte)uVar10 & 0x1f);
                  iVar5 = iVar11 - iVar2;
                  if (iVar5 == 0 || iVar11 < iVar2) {
                    iVar2 = iVar2 - iVar11;
                    iVar11 = iVar5;
                    do {
                      *pBVar12 = (uchar)((int)uVar6 >> ((byte)iVar2 & 0x1f));
                      pBVar12 = pBVar12 + 1;
                      iVar5 = iVar11 + 8;
                      iVar2 = iVar2 + -8;
                      bVar1 = iVar11 < -7;
                      iVar11 = iVar5;
                    } while (bVar1);
                  }
                }
                uVar3 = uVar3 + 1;
              } while (uVar3 != uVar13);
            }
            local_b0.current = pBVar12;
            if (local_b0.end < pBVar12) {
              ffpmsg("rice_encode: end of buffer");
              free(__ptr);
              goto LAB_001fe972;
            }
            local_b0.bits_to_go = iVar5;
            local_b0.bitbuffer = uVar6;
            uVar10 = local_70;
          }
          else {
            output_nbits(&local_b0,0,5);
          }
        }
        else {
          uVar9 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> uVar9 == 0; uVar9 = uVar9 - 1) {
            }
          }
          uVar3 = (ulong)uVar9;
          if (uVar9 < 0x19) goto LAB_001fe787;
          output_nbits(&local_b0,0x1a,5);
          if (0 < iVar11) {
            uVar13 = 0;
            do {
              output_nbits(&local_b0,*(int *)((long)__ptr + uVar13 * 4),0x20);
              uVar13 = uVar13 + 1;
            } while (uVar10 != uVar13);
          }
        }
        lVar8 = local_50 + local_60;
        a = (int *)((long)local_48 + local_58);
      } while (lVar8 < (long)local_68);
    }
    pBVar12 = local_b0.current;
    if (local_b0.bits_to_go < 8) {
      *local_b0.current = (uchar)(local_b0.bitbuffer << ((byte)local_b0.bits_to_go & 0x1f));
      pBVar12 = local_b0.current + 1;
    }
    free(__ptr);
    local_b0.start._0_4_ = (int)pBVar12 - (int)local_b0.start;
  }
  return (int)local_b0.start;
}

Assistant:

int fits_rcomp(int a[],		/* input array			*/
	  int nx,		/* number of input pixels	*/
	  unsigned char *c,	/* output buffer		*/
	  int clen,		/* max length of output		*/
	  int nblock)		/* coding block size		*/
{
Buffer bufmem, *buffer = &bufmem;
/* int bsize;  */
int i, j, thisblock;
int lastpix, nextpix, pdiff;
int v, fs, fsmask, top, fsmax, fsbits, bbits;
int lbitbuffer, lbits_to_go;
unsigned int psum;
double pixelsum, dpsum;
unsigned int *diff;

    /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 4;   */

/*    nblock = 32; now an input parameter*/
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return(-1);
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 5;
    fsmax = 25;

    bbits = 1<<fsbits;

    /*
     * Set up buffer pointers
     */
    buffer->start = c;
    buffer->current = c;
    buffer->end = c+clen;
    buffer->bits_to_go = 8;
    /*
     * array for differences mapped to non-negative values
     */
    diff = (unsigned int *) malloc(nblock*sizeof(unsigned int));
    if (diff == (unsigned int *) NULL) {
        ffpmsg("fits_rcomp: insufficient memory");
	return(-1);
    }
    /*
     * Code in blocks of nblock pixels
     */
    start_outputing_bits(buffer);

    /* write out first int value to the first 4 bytes of the buffer */
    if (output_nbits(buffer, a[0], 32) == EOF) {
        ffpmsg("rice_encode: end of buffer");
        free(diff);
        return(-1);
    }

    lastpix = a[0];  /* the first difference will always be zero */

    thisblock = nblock;
    for (i=0; i<nx; i += nblock) {
	/* last block may be shorter */
	if (nx-i < nblock) thisblock = nx-i;
	/*
	 * Compute differences of adjacent pixels and map them to unsigned values.
	 * Note that this may overflow the integer variables -- that's
	 * OK, because we can recover when decompressing.  If we were
	 * compressing shorts or bytes, would want to do this arithmetic
	 * with short/byte working variables (though diff will still be
	 * passed as an int.)
	 *
	 * compute sum of mapped pixel values at same time
	 * use double precision for sum to allow 32-bit integer inputs
	 */
	pixelsum = 0.0;
	for (j=0; j<thisblock; j++) {
	    nextpix = a[i+j];
	    pdiff = nextpix - lastpix;
	    diff[j] = (unsigned int) ((pdiff<0) ? ~(pdiff<<1) : (pdiff<<1));
	    pixelsum += diff[j];
	    lastpix = nextpix;
	}

	/*
	 * compute number of bits to split from sum
	 */
	dpsum = (pixelsum - (thisblock/2) - 1)/thisblock;
	if (dpsum < 0) dpsum = 0.0;
	psum = ((unsigned int) dpsum ) >> 1;
	for (fs = 0; psum>0; fs++) psum >>= 1;

	/*
	 * write the codes
	 * fsbits ID bits used to indicate split level
	 */
	if (fs >= fsmax) {
	    /* Special high entropy case when FS >= fsmax
	     * Just write pixel difference values directly, no Rice coding at all.
	     */
	    if (output_nbits(buffer, fsmax+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    for (j=0; j<thisblock; j++) {
		if (output_nbits(buffer, diff[j], bbits) == EOF) {
                    ffpmsg("rice_encode: end of buffer");
                    free(diff);
		    return(-1);
		}
	    }
	} else if (fs == 0 && pixelsum == 0) {
	    /*
	     * special low entropy case when FS = 0 and pixelsum=0 (all
	     * pixels in block are zero.)
	     * Output a 0 and return
	     */
	    if (output_nbits(buffer, 0, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	} else {
	    /* normal case: not either very high or very low entropy */
	    if (output_nbits(buffer, fs+1, fsbits) == EOF) {
                ffpmsg("rice_encode: end of buffer");
                free(diff);
		return(-1);
	    }
	    fsmask = (1<<fs) - 1;
	    /*
	     * local copies of bit buffer to improve optimization
	     */
	    lbitbuffer = buffer->bitbuffer;
	    lbits_to_go = buffer->bits_to_go;
	    for (j=0; j<thisblock; j++) {
		v = diff[j];
		top = v >> fs;
		/*
		 * top is coded by top zeros + 1
		 */
		if (lbits_to_go >= top+1) {
		    lbitbuffer <<= top+1;
		    lbitbuffer |= 1;
		    lbits_to_go -= top+1;
		} else {
		    lbitbuffer <<= lbits_to_go;
		    putcbuf(lbitbuffer & 0xff,buffer);

		    for (top -= lbits_to_go; top>=8; top -= 8) {
			putcbuf(0, buffer);
		    }
		    lbitbuffer = 1;
		    lbits_to_go = 7-top;
		}
		/*
		 * bottom FS bits are written without coding
		 * code is output_nbits, moved into this routine to reduce overheads
		 * This code potentially breaks if FS>24, so I am limiting
		 * FS to 24 by choice of FSMAX above.
		 */
		if (fs > 0) {
		    lbitbuffer <<= fs;
		    lbitbuffer |= v & fsmask;
		    lbits_to_go -= fs;
		    while (lbits_to_go <= 0) {
			putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
			lbits_to_go += 8;
		    }
		}
	    }

	    /* check if overflowed output buffer */
	    if (buffer->current > buffer->end) {
                 ffpmsg("rice_encode: end of buffer");
                 free(diff);
		 return(-1);
	    }
	    buffer->bitbuffer = lbitbuffer;
	    buffer->bits_to_go = lbits_to_go;
	}
    }
    done_outputing_bits(buffer);
    free(diff);
    /*
     * return number of bytes used
     */
    return(buffer->current - buffer->start);
}